

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WithDiamondsAsTrump.h
# Opt level: O2

void __thiscall WithDiamondsAsTrump::WithDiamondsAsTrump(WithDiamondsAsTrump *this)

{
  initializer_list<Card> __l;
  allocator_type local_91;
  _Vector_base<Card,_std::allocator<Card>_> local_90;
  Card local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  (this->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_DifferentTrumpRule).super_Rule._vptr_Rule = (_func_int **)&PTR_isTrump_0010eb38;
  local_78.m_suit = DIAMONDS;
  local_78.m_value = NINE;
  uStack_70 = 0x400000000;
  local_68 = 0x300000000;
  uStack_60 = 0x500000000;
  local_58 = 0x100000000;
  uStack_50 = 0x100000001;
  local_48 = 0x100000002;
  uStack_40 = 0x100000003;
  local_38 = 0x200000000;
  uStack_30 = 0x200000001;
  local_28 = 0x200000002;
  uStack_20 = 0x200000003;
  local_18 = 0x400000001;
  __l._M_len = 0xd;
  __l._M_array = &local_78;
  std::vector<Card,_std::allocator<Card>_>::vector
            ((vector<Card,_std::allocator<Card>_> *)&local_90,__l,&local_91);
  std::vector<Card,_std::allocator<Card>_>::_M_move_assign
            (&(this->super_DifferentTrumpRule).m_trumpCards,&local_90);
  std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base(&local_90);
  return;
}

Assistant:

WithDiamondsAsTrump() {
        m_trumpCards = std::vector<Card>{
                Card(Suit::DIAMONDS, CardValue::NINE),
                Card(Suit::DIAMONDS, CardValue::TEN),
                Card(Suit::DIAMONDS, CardValue::KING),
                Card(Suit::DIAMONDS, CardValue::ASS),
                Card(Suit::DIAMONDS, CardValue::JACK),
                Card(Suit::HEARTS, CardValue::JACK),
                Card(Suit::SPADES, CardValue::JACK),
                Card(Suit::CLUBS, CardValue::JACK),
                Card(Suit::DIAMONDS, CardValue::QUEEN),
                Card(Suit::HEARTS, CardValue::QUEEN),
                Card(Suit::SPADES, CardValue::QUEEN),
                Card(Suit::CLUBS, CardValue::QUEEN),
                Card(Suit::HEARTS, CardValue::TEN)};
    }